

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBasicDrawTests.cpp
# Opt level: O3

void __thiscall
vkt::Draw::anon_unknown_0::DrawTestInstanceBase::generateRefImage
          (DrawTestInstanceBase *this,PixelBufferAccess *access,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *vertices,
          vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *colors)

{
  pointer pVVar1;
  ulong uVar2;
  PrimitiveType primitiveType;
  Renderer renderer;
  Program program;
  PassthruFragShader fragShader;
  MultisamplePixelBufferAccess colorBuffer;
  PassthruVertShader vertShader;
  RenderTarget renderTarget;
  Renderer local_381;
  Program local_380;
  int local_368;
  int iStack_364;
  undefined8 uStack_360;
  VertexAttrib local_358;
  undefined8 local_330;
  undefined8 uStack_328;
  pointer local_320;
  undefined8 local_318;
  undefined8 uStack_310;
  FragmentShader local_300;
  MultisamplePixelBufferAccess local_2c8;
  VertexShader local_2a0;
  RenderState local_268;
  PrimitiveList local_178;
  DrawCommand local_158;
  RenderTarget local_128;
  
  rr::VertexShader::VertexShader(&local_2a0,2,1);
  local_2a0._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d325c0;
  *(undefined8 *)
   local_2a0.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  (local_2a0.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  rr::FragmentShader::FragmentShader(&local_300,1,1);
  local_300._vptr_FragmentShader = (_func_int **)&PTR_shadeFragments_00d325f0;
  (local_300.m_inputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  (local_300.m_outputs.
   super__Vector_base<rr::FragmentOutputInfo,_std::allocator<rr::FragmentOutputInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_380.geometryShader = (GeometryShader *)0x0;
  local_380.vertexShader = &local_2a0;
  local_380.fragmentShader = &local_300;
  rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(&local_2c8,access);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_268);
  rr::MultisamplePixelBufferAccess::MultisamplePixelBufferAccess
            ((MultisamplePixelBufferAccess *)&local_358);
  rr::RenderTarget::RenderTarget
            (&local_128,&local_2c8,(MultisamplePixelBufferAccess *)&local_268,
             (MultisamplePixelBufferAccess *)&local_358);
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)&local_358,&local_2c8);
  local_368 = local_358.instanceDivisor;
  iStack_364 = (int)local_358.pointer;
  uStack_360 = 0;
  local_268.cullMode = CULLMODE_NONE;
  local_268.provokingVertexConvention = PROVOKINGVERTEX_LAST;
  local_268.rasterization.winding = WINDING_CCW;
  local_268.rasterization.horizontalFill = FILL_LEFT;
  local_268.rasterization.verticalFill = FILL_BOTTOM;
  local_268.rasterization.viewportOrientation = VIEWPORTORIENTATION_LAST;
  rr::FragmentOperationState::FragmentOperationState(&local_268.fragOps);
  local_268.point.pointSize = 1.0;
  local_268.viewport.rect.left = 0;
  local_268.viewport.rect.bottom = 0;
  local_268.viewport.rect.width = local_368;
  local_268.viewport.rect.height = iStack_364;
  local_268.viewport.zn = 0.0;
  local_268.viewport.zf = 1.0;
  local_268.line.lineWidth = 1.0;
  local_268.restart.enabled = false;
  local_268.restart.restartIndex = 0xffffffff;
  local_268.viewportOrientation = VIEWPORTORIENTATION_LOWER_LEFT;
  local_268.rasterization._8_8_ = local_268.rasterization._8_8_ & 0xffffffff;
  rr::Renderer::Renderer(&local_381);
  pVVar1 = (vertices->
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  local_358.type = VERTEXATTRIBTYPE_FLOAT;
  local_358.size = 4;
  local_358.stride = 0x10;
  local_358.instanceDivisor = 0;
  local_358.pointer._0_4_ = (int)pVVar1;
  local_358.pointer._4_4_ = (undefined4)((ulong)pVVar1 >> 0x20);
  local_358.generic.v._0_8_ = 0;
  local_358.generic.v._8_8_ = 0;
  local_320 = (colors->
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
  local_330 = 0x400000000;
  uStack_328 = 0x10;
  local_318 = 0;
  uStack_310 = 0;
  uVar2 = (ulong)(this->m_data).topology;
  primitiveType = PRIMITIVETYPE_LAST;
  if (uVar2 < 10) {
    primitiveType = *(PrimitiveType *)(&DAT_00b37914 + uVar2 * 4);
  }
  rr::PrimitiveList::PrimitiveList
            (&local_178,primitiveType,
             (int)((ulong)((long)(vertices->
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) >> 4),0
            );
  local_158.program = &local_380;
  local_158.numVertexAttribs = 2;
  local_158.state = &local_268;
  local_158.renderTarget = &local_128;
  local_158.vertexAttribs = &local_358;
  local_158.primitives = &local_178;
  rr::Renderer::draw(&local_381,&local_158);
  rr::Renderer::~Renderer(&local_381);
  rr::FragmentShader::~FragmentShader(&local_300);
  rr::VertexShader::~VertexShader(&local_2a0);
  return;
}

Assistant:

void DrawTestInstanceBase::generateRefImage (const tcu::PixelBufferAccess& access, const std::vector<tcu::Vec4>& vertices, const std::vector<tcu::Vec4>& colors) const
{
	const PassthruVertShader				vertShader;
	const PassthruFragShader				fragShader;
	const rr::Program						program			(&vertShader, &fragShader);
	const rr::MultisamplePixelBufferAccess	colorBuffer		= rr::MultisamplePixelBufferAccess::fromSinglesampleAccess(access);
	const rr::RenderTarget					renderTarget	(colorBuffer);
	const rr::RenderState					renderState		((rr::ViewportState(colorBuffer)));
	const rr::Renderer						renderer;

	const rr::VertexAttrib	vertexAttribs[] =
	{
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, &vertices[0]),
		rr::VertexAttrib(rr::VERTEXATTRIBTYPE_FLOAT, 4, sizeof(tcu::Vec4), 0, &colors[0])
	};

	renderer.draw(rr::DrawCommand(renderState,
								  renderTarget,
								  program,
								  DE_LENGTH_OF_ARRAY(vertexAttribs),
								  &vertexAttribs[0],
								  rr::PrimitiveList(mapVkPrimitiveTopology(m_data.topology), (deUint32)vertices.size(), 0)));
}